

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,Flags flags)

{
  InternalFlag value;
  bool bVar1;
  ostream *output;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  Flags local_59;
  Error local_58;
  EnumSet<Corrade::Utility::Arguments::Flag,_(unsigned_char)__xff_> local_1a;
  EnumSet local_19;
  Arguments *local_18;
  Arguments *this_local;
  Flags flags_local;
  
  local_18 = this;
  this_local._7_1_ = flags._value;
  value = Containers::EnumSet::operator_cast_to_unsigned_char((EnumSet *)((long)&this_local + 7));
  Containers::EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
            (&this->_flags,value);
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  std::__cxx11::string::string((string *)&this->_prefix);
  std::__cxx11::string::string((string *)&this->_command);
  std::__cxx11::string::string((string *)&this->_help);
  Containers::
  Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
  ::Array(&this->_entries);
  Containers::
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  ::Array(&this->_values);
  Containers::
  Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
  ::Array(&this->_arrayValues);
  Containers::
  Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
  ::Array(&this->_skippedPrefixes);
  Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::Array(&this->_booleans);
  this->_parseErrorCallback = anon_unknown_3::defaultParseErrorCallback;
  Containers::EnumSet<Corrade::Utility::Arguments::Flag,_(unsigned_char)'\xff'>::EnumSet
            (&local_1a,IgnoreUnknownOptions);
  local_19 = (EnumSet)Containers::EnumSet<Corrade::Utility::Arguments::Flag,_(unsigned_char)'\xff'>
                      ::operator&((EnumSet<Corrade::Utility::Arguments::Flag,_(unsigned_char)__xff_>
                                   *)((long)&this_local + 7),local_1a);
  bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_19);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"help",&local_81);
    addBooleanOption(this,'h',&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"help",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"display this help message and exit",&local_d1)
    ;
    std::__cxx11::string::string((string *)&local_f8);
    setHelp(this,&local_a8,&local_d0,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    return;
  }
  output = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
  Error::Error(&local_58,output,local_59);
  Debug::operator<<(&local_58.super_Debug,
                    "Utility::Arguments: Flag::IgnoreUnknownOptions allowed only in the prefixed variant"
                   );
  Error::~Error(&local_58);
  abort();
}

Assistant:

Arguments::Arguments(Flags flags): _flags{InternalFlag(std::uint8_t(flags))}, _parseErrorCallback{defaultParseErrorCallback} {
    CORRADE_ASSERT(!(flags & Flag::IgnoreUnknownOptions),
        "Utility::Arguments: Flag::IgnoreUnknownOptions allowed only in the prefixed variant", );

    /* Add help option */
    addBooleanOption('h', "help");
    setHelp("help", "display this help message and exit");
}